

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteRepeated<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Field<google::protobuf::json_internal::UnparseProto3Type> field)

{
  Msg<google::protobuf::json_internal::UnparseProto3Type> *msg_00;
  bool bVar1;
  MessageType MVar2;
  size_t sVar3;
  Status *_status;
  size_t idx;
  char *pcVar4;
  string_view sVar5;
  string_view sVar6;
  bool first;
  StatusOr<long> x;
  undefined8 uStack_d8;
  _Head_base<0UL,_unsigned_long,_false> local_a0;
  _Head_base<0UL,_long,_false> local_98;
  AlphaNum local_90;
  undefined1 local_60 [48];
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"[",1);
  writer->indent_ = writer->indent_ + 1;
  sVar3 = UnparseProto3Type::GetSize(field,msg);
  first = true;
  idx = 0;
  do {
    if (sVar3 == idx) {
      writer->indent_ = writer->indent_ + -1;
      if (first == false) {
        JsonWriter::NewLine(writer);
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"]",1);
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    sVar5 = Proto3Type::FieldTypeName(field);
    sVar6._M_str = sVar5._M_str;
    sVar6._M_len = (size_t)sVar6._M_str;
    MVar2 = ClassifyMessage((json_internal *)sVar5._M_len,sVar6);
    if (MVar2 == kValue) {
      ResolverPool::Field::MessageType((Field *)&local_90);
      absl::lts_20240722::Status::Status((Status *)this,(Status *)&local_90);
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::EnsureOk
                  ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                   &local_90);
        pcVar4 = local_90.piece_._M_str;
        UnparseProto3Type::GetMessage((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
                    ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)&x);
          bVar1 = IsEmpty<google::protobuf::json_internal::UnparseProto3Type>
                            ((Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                             CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                                      x.super_StatusOrData<long>.field_1.data_._0_4_),
                             (Desc<google::protobuf::json_internal::UnparseProto3Type> *)pcVar4);
          *(undefined8 *)this = 1;
        }
        else {
          bVar1 = false;
        }
        absl::lts_20240722::Status::~Status((Status *)&x);
      }
      else {
        bVar1 = false;
      }
      absl::lts_20240722::Status::~Status((Status *)&local_90);
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
      absl::lts_20240722::Status::~Status((Status *)this);
      if (bVar1 == false) goto LAB_0029f53c;
    }
    else {
LAB_0029f53c:
      JsonWriter::WriteComma(writer,&first);
      JsonWriter::NewLine(writer);
      switch((field->raw_->field_0)._impl_.kind_) {
      case 1:
        UnparseProto3Type::GetDouble((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                  ((StatusOrData<double> *)&x);
        JsonWriter::Write(writer,(double)CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                                                  x.super_StatusOrData<long>.field_1.data_._0_4_));
LAB_0029fa4e:
        absl::lts_20240722::Status::~Status((Status *)&x);
        *(undefined8 *)this = 1;
        goto LAB_0029fa5f;
      case 2:
        UnparseProto3Type::GetFloat((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<float>::EnsureOk
                    ((StatusOrData<float> *)&x);
          JsonWriter::Write(writer,(float)x.super_StatusOrData<long>.field_1.data_._0_4_);
          goto LAB_0029fa4e;
        }
        break;
      case 3:
      case 0x10:
      case 0x12:
        UnparseProto3Type::GetInt64((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          if ((writer->options_).unquote_int64_if_possible == true) {
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&x.super_StatusOrData<long>);
            bVar1 = RoundTripsThroughDouble<long>
                              (CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                                        x.super_StatusOrData<long>.field_1.data_._0_4_));
            if (bVar1) {
              absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                        (&x.super_StatusOrData<long>);
              JsonWriter::Write(writer,CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                                                x.super_StatusOrData<long>.field_1.data_._0_4_));
              goto LAB_0029fa4e;
            }
          }
          absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                    (&x.super_StatusOrData<long>);
          local_98._M_head_impl =
               CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                        x.super_StatusOrData<long>.field_1.data_._0_4_);
          JsonWriter::Write<long>(writer,(Quoted<long> *)&local_98);
          goto LAB_0029fa4e;
        }
        break;
      case 4:
      case 6:
        UnparseProto3Type::GetUInt64((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          if ((writer->options_).unquote_int64_if_possible == true) {
            absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                      ((StatusOrData<unsigned_long> *)&x);
            bVar1 = RoundTripsThroughDouble<unsigned_long>
                              (CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                                        x.super_StatusOrData<long>.field_1.data_._0_4_));
            if (bVar1) {
              absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                        ((StatusOrData<unsigned_long> *)&x);
              JsonWriter::Write(writer,CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                                                x.super_StatusOrData<long>.field_1.data_._0_4_));
              goto LAB_0029fa4e;
            }
          }
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                    ((StatusOrData<unsigned_long> *)&x);
          local_a0._M_head_impl =
               CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                        x.super_StatusOrData<long>.field_1.data_._0_4_);
          JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_a0);
          goto LAB_0029fa4e;
        }
        break;
      case 5:
      case 0xf:
      case 0x11:
        UnparseProto3Type::GetInt32((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                    ((StatusOrData<int> *)&x);
          JsonWriter::Write(writer,x.super_StatusOrData<long>.field_1.data_._0_4_);
          goto LAB_0029fa4e;
        }
        break;
      case 7:
      case 0xd:
        UnparseProto3Type::GetUInt32((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::EnsureOk
                    ((StatusOrData<unsigned_int> *)&x);
          JsonWriter::Write(writer,x.super_StatusOrData<long>.field_1.data_._0_4_);
          goto LAB_0029fa4e;
        }
        break;
      case 8:
        UnparseProto3Type::GetBool((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk
                    ((StatusOrData<bool> *)&x);
          pcVar4 = "false";
          if ((ulong)(byte)x.super_StatusOrData<long>.field_1.data_._0_1_ != 0) {
            pcVar4 = "true";
          }
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,pcVar4,
                     (ulong)(byte)x.super_StatusOrData<long>.field_1.data_._0_1_ ^ 5);
          goto LAB_0029fa4e;
        }
        break;
      case 9:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x,field,
                   &writer->scratch_buf_,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x);
          local_60._36_4_ = x.super_StatusOrData<long>.field_1.data_._4_4_;
          local_60._32_4_ = x.super_StatusOrData<long>.field_1.data_._0_4_;
          JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                    (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            (local_60 + 0x20));
          goto LAB_0029fa4e;
        }
        break;
      case 10:
      case 0xb:
        UnparseProto3Type::GetMessage((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
                    ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)&x);
          msg_00 = (Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                   CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                            x.super_StatusOrData<long>.field_1.data_._0_4_);
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
                    ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)&x);
          WriteMessage<google::protobuf::json_internal::UnparseProto3Type>
                    (this,writer,msg_00,
                     *(Desc<google::protobuf::json_internal::UnparseProto3Type> **)
                      CONCAT44(x.super_StatusOrData<long>.field_1.data_._4_4_,
                               x.super_StatusOrData<long>.field_1.data_._0_4_),false);
        }
        break;
      case 0xc:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x,field,
                   &writer->scratch_buf_,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x);
          sVar5._M_len._4_4_ = x.super_StatusOrData<long>.field_1.data_._4_4_;
          sVar5._M_len._0_4_ = x.super_StatusOrData<long>.field_1.data_._0_4_;
          sVar5._M_str = (char *)uStack_d8;
          JsonWriter::WriteBase64(writer,sVar5);
          goto LAB_0029fa4e;
        }
        break;
      case 0xe:
        UnparseProto3Type::GetEnumValue((UnparseProto3Type *)&x,field,msg,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                    ((StatusOrData<int> *)&x);
          WriteEnum<google::protobuf::json_internal::UnparseProto3Type>
                    (writer,field,x.super_StatusOrData<long>.field_1.data_._0_4_,kUnquoted);
          goto LAB_0029fa4e;
        }
        break;
      default:
        sVar6 = absl::lts_20240722::NullSafeStringView("unsupported field type: ");
        x.super_StatusOrData<long>.field_0 =
             (anon_union_8_1_1246618d_for_StatusOrData<long>_1)sVar6._M_len;
        x.super_StatusOrData<long>.field_1.data_._0_4_ = sVar6._M_str._0_4_;
        x.super_StatusOrData<long>.field_1.data_._4_4_ = sVar6._M_str._4_4_;
        absl::lts_20240722::AlphaNum::AlphaNum(&local_90,(field->raw_->field_0)._impl_.kind_);
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_60,(AlphaNum *)&x);
        absl::lts_20240722::InvalidArgumentError(this,local_60._8_8_,local_60._0_8_);
        std::__cxx11::string::~string((string *)local_60);
        goto LAB_0029f9c0;
      }
      absl::lts_20240722::Status::~Status((Status *)&x);
LAB_0029f9c0:
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
LAB_0029fa5f:
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

absl::Status WriteRepeated(JsonWriter& writer, const Msg<Traits>& msg,
                           Field<Traits> field) {
  writer.Write("[");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kValue) {
      bool empty = false;
      RETURN_IF_ERROR(Traits::WithFieldType(
          field, [&](const Desc<Traits>& desc) -> absl::Status {
            auto inner = Traits::GetMessage(field, msg, i);
            RETURN_IF_ERROR(inner.status());
            empty = IsEmpty<Traits>(**inner, desc);
            return absl::OkStatus();
          }));

      // Empty google.protobuf.Values are silently discarded.
      if (empty) {
        continue;
      }
    }
    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(WriteSingular<Traits>(writer, field, msg, i));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("]");
  return absl::OkStatus();
}